

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,BinaryExpr *node)

{
  OpType OVar1;
  OpType *k;
  BuilderContext *pBVar2;
  element_type *peVar3;
  shared_ptr<mocker::ir::Addr> *psVar4;
  shared_ptr<mocker::ir::Reg> *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  OpType *args_1_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar10;
  shared_ptr<mocker::ir::Addr> sVar11;
  shared_ptr<mocker::ir::Reg> val_1;
  shared_ptr<mocker::ir::Reg> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  OpType op;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  shared_ptr<mocker::ir::Addr> lhsAddr;
  OpType local_1ac;
  float local_1a8;
  OpType local_1a4 [3];
  shared_ptr<mocker::ir::Addr> rhsVal;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  _Elt_pointer psStack_170;
  __node_base local_168;
  _Elt_pointer psStack_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  initializer_list<std::pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  _Any_data local_50;
  _Elt_pointer local_40;
  __node_base_ptr p_Stack_38;
  
  if (node->op - Subscript < 2) {
    bVar8 = (this->ctx->logicalExprInfo).empty;
    (this->ctx->logicalExprInfo).empty = true;
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::ASTNode,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&val_1,
               (__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &(node->super_Expression).super_ASTNode.
                super_enable_shared_from_this<mocker::ast::ASTNode>);
    std::static_pointer_cast<mocker::ast::Expression,mocker::ast::ASTNode>
              ((shared_ptr<mocker::ast::ASTNode> *)&res);
    rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &(res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Addr;
    rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    getElementPtr((Builder *)&lhsAddr,(shared_ptr<mocker::ast::ASTNode> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&val_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pBVar2 = this->ctx;
    (pBVar2->logicalExprInfo).empty = bVar8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rhsVal,"valOrInstPtr",(allocator<char> *)&val_1);
    BuilderContext::makeTempLocalReg((BuilderContext *)&res,(string *)pBVar2);
    std::__cxx11::string::~string((string *)&rhsVal);
    BuilderContext::
    emplaceInst<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,&res,&lhsAddr);
    pBVar2 = this->ctx;
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              (local_70,&res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    BuilderContext::setExprAddr(pBVar2,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    psVar4 = &lhsAddr;
LAB_001376fa:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(psVar4->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount);
    return;
  }
  if (node->op == Assign) {
    peVar3 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
              (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    BuilderContext::getExprAddr((BuilderContext *)&rhsVal,(NodeID)this->ctx);
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Expression,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&res,
               &(node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>)
    ;
    getElementPtr((Builder *)&lhsAddr,(shared_ptr<mocker::ast::ASTNode> *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    BuilderContext::
    emplaceInst<mocker::ir::Store,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
              (this->ctx,&lhsAddr,&rhsVal);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&lhsAddr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    psVar4 = &rhsVal;
    goto LAB_001376fa;
  }
  k = &node->op;
  local_40 = (_Elt_pointer)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  lhsAddr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)node;
  lhsAddr.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  local_50._M_unused._M_object = node;
  local_50._8_8_ = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  OVar1 = node->op + ~Ge;
  if (OVar1 < (Le|Lt)) {
    pBVar2 = this->ctx;
    op = OVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rhsVal,"resV",(allocator<char> *)&res);
    BuilderContext::makeTempLocalReg((BuilderContext *)&val_1,(string *)pBVar2);
    std::__cxx11::string::~string((string *)&rhsVal);
    pBVar2 = this->ctx;
    std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ir::Reg,void>
              (local_80,&val_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
    BuilderContext::setExprAddr(pBVar2,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    bVar8 = (this->ctx->logicalExprInfo).empty;
    (this->ctx->logicalExprInfo).empty = true;
    peVar3 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
              (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    sVar11 = BuilderContext::getExprAddr((BuilderContext *)local_1e8,(NodeID)this->ctx);
    (this->ctx->logicalExprInfo).empty = true;
    peVar3 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
              (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0),
               sVar11.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    pBVar2 = this->ctx;
    (pBVar2->logicalExprInfo).empty = bVar8;
    BuilderContext::getExprAddr((BuilderContext *)local_1f8,(NodeID)pBVar2);
    BuilderContext::getExprType((BuilderContext *)&rhsVal,(NodeID)this->ctx);
    bVar8 = isStrTy(this,(shared_ptr<mocker::ast::Type> *)&rhsVal);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (bVar8) {
      if ((operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_ == '\0') &&
         (iVar9 = __cxa_guard_acquire(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_)
         , iVar9 != 0)) {
        s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&res,
                     "#string#equal",0xd);
        rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&aStack_180;
        rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ._4_4_,6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            &local_218) {
          aStack_180._8_8_ = local_218._8_8_;
        }
        else {
          rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        aStack_180._M_allocated_capacity._1_7_ = local_218._M_allocated_capacity._1_7_;
        aStack_180._M_local_buf[0] = local_218._M_local_buf[0];
        res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_218._M_local_buf[0] = '\0';
        local_1a4[2] = 7;
        res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_218;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[16],_true>
                  ((pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&psStack_170,local_1a4 + 2,(char (*) [16])"#string#inequal");
        local_1a4[1] = 10;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[19],_true>
                  (&local_148,local_1a4 + 1,(char (*) [19])"#string#less_equal");
        local_1a4[0] = Lt;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[13],_true>
                  (&local_120,local_1a4,(char (*) [13])"#string#less");
        local_1a8 = 1.54143e-44;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[19],_true>
                  (&local_f8,(OpType *)&local_1a8,(char (*) [19])"#string#less_equal");
        local_1ac = Gt;
        std::
        pair<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<mocker::ast::BinaryExpr::OpType,_const_char_(&)[13],_true>
                  (&local_d0,&local_1ac,(char (*) [13])"#string#less");
        local_60._M_len = 6;
        local_60._M_array = (iterator)&rhsVal;
        SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::SmallMap(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,&local_60);
        lVar10 = 0xd0;
        do {
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar10));
          lVar10 = lVar10 + -0x28;
        } while (lVar10 != -0x20);
        std::__cxx11::string::~string((string *)&res);
        __cxa_atexit(SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::~SmallMap,&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_);
      }
      uVar7 = local_1f8._8_8_;
      uVar6 = local_1f8._0_8_;
      if ((*k | LogicalAnd) == Ge) {
        local_1f8._0_8_ = local_1e8._0_8_;
        local_1f8._8_8_ = local_1e8._8_8_;
        local_1e8._0_8_ = uVar6;
        local_1e8._8_8_ = uVar7;
      }
      pBVar2 = this->ctx;
      args_1 = SmallMap<mocker::ast::BinaryExpr::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::at(&operator()(mocker::ast::BinaryExpr_const&)::opMap_abi_cxx11_,k);
      BuilderContext::
      emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,std::__cxx11::string_const&,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                (pBVar2,&val_1,args_1,(shared_ptr<mocker::ir::Addr> *)local_1e8,
                 (shared_ptr<mocker::ir::Addr> *)local_1f8);
    }
    else {
      BuilderContext::
      emplaceInst<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::RelationInst::OpType&,std::shared_ptr<mocker::ir::Addr>&,std::shared_ptr<mocker::ir::Addr>&>
                (this->ctx,&val_1,&op,(shared_ptr<mocker::ir::Addr> *)local_1e8,
                 (shared_ptr<mocker::ir::Addr> *)local_1f8);
    }
    BuilderContext::checkLogicalExpr(this->ctx,&node->super_Expression);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8));
    psVar5 = &val_1;
  }
  else {
    if (node->op - LogicalOr < 2) {
      translateLogicBinary(this,node);
      goto LAB_00137ba8;
    }
    BuilderContext::getExprType((BuilderContext *)&rhsVal,(NodeID)this->ctx);
    bVar8 = isStrTy(this,(shared_ptr<mocker::ast::Type> *)&rhsVal);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (bVar8) {
      bVar8 = (this->ctx->logicalExprInfo).empty;
      (this->ctx->logicalExprInfo).empty = true;
      peVar3 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
                (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      peVar3 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
                (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      pBVar2 = this->ctx;
      (pBVar2->logicalExprInfo).empty = bVar8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rhsVal,"newStr",(allocator<char> *)&val_1);
      BuilderContext::makeTempLocalReg((BuilderContext *)&res,(string *)pBVar2);
      std::__cxx11::string::~string((string *)&rhsVal);
      pBVar2 = this->ctx;
      BuilderContext::getExprAddr((BuilderContext *)&rhsVal,(NodeID)pBVar2);
      BuilderContext::getExprAddr((BuilderContext *)&val_1,(NodeID)this->ctx);
      BuilderContext::
      emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
                (pBVar2,&res,(char (*) [12])"#string#add",&rhsVal,
                 (shared_ptr<mocker::ir::Addr> *)&val_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&val_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pBVar2 = this->ctx;
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                (local_90,&res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      BuilderContext::setExprAddr(pBVar2,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)local_90);
      this_00 = &local_88;
    }
    else {
      if ((operator()(mocker::ast::BinaryExpr_const&)::opMap == '\0') &&
         (iVar9 = __cxa_guard_acquire(&operator()(mocker::ast::BinaryExpr_const&)::opMap),
         iVar9 != 0)) {
        rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x3;
        rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000004;
        aStack_180._M_allocated_capacity = 0x30000000c;
        aStack_180._8_8_ = (_Elt_pointer)0x40000000d;
        psStack_170 = (_Elt_pointer)0x50000000e;
        local_168._M_nxt = (_Hash_node_base *)0x60000000f;
        psStack_160 = (_Elt_pointer)0x700000010;
        local_158._M_allocated_capacity = 0x800000011;
        local_158._8_8_ = (_Elt_pointer)0x900000012;
        res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
        res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&rhsVal;
        SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::SmallMap
                  (&operator()(mocker::ast::BinaryExpr_const&)::opMap,
                   (initializer_list<std::pair<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>_>
                    *)&res);
        __cxa_atexit(SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>
                     ::~SmallMap,&operator()(mocker::ast::BinaryExpr_const&)::opMap,&__dso_handle);
        __cxa_guard_release(&operator()(mocker::ast::BinaryExpr_const&)::opMap);
      }
      bVar8 = (this->ctx->logicalExprInfo).empty;
      (this->ctx->logicalExprInfo).empty = true;
      peVar3 = (node->lhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
                (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      peVar3 = (node->rhs).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*(peVar3->super_ASTNode)._vptr_ASTNode[3])
                (peVar3,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
      pBVar2 = this->ctx;
      (pBVar2->logicalExprInfo).empty = bVar8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rhsVal,"",(allocator<char> *)&val_1);
      BuilderContext::makeTempLocalReg((BuilderContext *)&res,(string *)pBVar2);
      std::__cxx11::string::~string((string *)&rhsVal);
      pBVar2 = this->ctx;
      args_1_00 = SmallMap<mocker::ast::BinaryExpr::OpType,_mocker::ir::ArithBinaryInst::OpType>::at
                            (&operator()(mocker::ast::BinaryExpr_const&)::opMap,k);
      BuilderContext::getExprAddr((BuilderContext *)&rhsVal,(NodeID)this->ctx);
      BuilderContext::getExprAddr((BuilderContext *)&val_1,(NodeID)this->ctx);
      BuilderContext::
      emplaceInst<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType_const&,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
                (pBVar2,&res,args_1_00,&rhsVal,(shared_ptr<mocker::ir::Addr> *)&val_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&val_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhsVal.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pBVar2 = this->ctx;
      std::__shared_ptr<mocker::ir::Addr,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<mocker::ir::Reg,void>
                (local_a0,&res.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>);
      BuilderContext::setExprAddr(pBVar2,(NodeID)node,(shared_ptr<mocker::ir::Addr> *)local_a0);
      this_00 = &local_98;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
    psVar5 = &res;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(psVar5->super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
LAB_00137ba8:
  Defer::~Defer((Defer *)&lhsAddr);
  return;
}

Assistant:

void Builder::operator()(const ast::BinaryExpr &node) const {
  using namespace std::string_literals;
  if (node.op == ast::BinaryExpr::Assign) {
    visit(*node.rhs);
    auto rhsVal = ctx.getExprAddr(node.rhs->getID());
    auto lhsAddr = getElementPtr(node.lhs);
    ctx.emplaceInst<Store>(lhsAddr, rhsVal);
    return;
  }
  if (node.op == ast::BinaryExpr::Subscript ||
      node.op == ast::BinaryExpr::Member) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    auto addr = getElementPtr(std::static_pointer_cast<ast::Expression>(
        const_cast<ast::BinaryExpr &>(node).shared_from_this()));
    ctx.getLogicalExprInfo().empty = bak;
    auto val = ctx.makeTempLocalReg("valOrInstPtr");
    ctx.emplaceInst<Load>(val, addr);
    ctx.setExprAddr(node.getID(), val);
    ctx.checkLogicalExpr(node);
    return;
  }

  Defer defer([&node, this] {
    if (ctx.isTrivial(node.lhs) && ctx.isTrivial(node.rhs))
      ctx.markExprTrivial(node);
  });

  // Eq, Ne, Lt, Gt, Le, Ge,
  if (ast::BinaryExpr::Eq <= node.op && node.op <= ast::BinaryExpr::Ge) {
    auto op = (RelationInst::OpType)(RelationInst::Eq +
                                     (node.op - ast::BinaryExpr::Eq));
    auto val = ctx.makeTempLocalReg("resV");
    ctx.setExprAddr(node.getID(), val);

    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.lhs);
    auto lhs = ctx.getExprAddr(node.lhs->getID());
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.rhs);
    ctx.getLogicalExprInfo().empty = bak;
    auto rhs = ctx.getExprAddr(node.rhs->getID());

    if (isStrTy(ctx.getExprType(node.lhs->getID()))) {
      static SmallMap<ast::BinaryExpr::OpType, std::string> opMap{
          {ast::BinaryExpr::Eq, "#string#equal"s},
          {ast::BinaryExpr::Ne, "#string#inequal"},
          {ast::BinaryExpr::Le, "#string#less_equal"},
          {ast::BinaryExpr::Lt, "#string#less"},
          {ast::BinaryExpr::Ge, "#string#less_equal"},
          {ast::BinaryExpr::Gt, "#string#less"},
      };
      if (node.op == ast::BinaryExpr::Ge || node.op == ast::BinaryExpr::Gt) {
        std::swap(lhs, rhs);
      }
      ctx.emplaceInst<Call>(val, opMap.at(node.op), lhs, rhs);
    } else {
      ctx.emplaceInst<RelationInst>(val, op, lhs, rhs);
    }

    ctx.checkLogicalExpr(node);
    return;
  }
  if (node.op == ast::BinaryExpr::LogicalAnd ||
      node.op == ast::BinaryExpr::LogicalOr) {
    translateLogicBinary(node);
    return;
  }
  // string
  if (isStrTy(ctx.getExprType(node.getID()))) {
    auto bak = ctx.getLogicalExprInfo().empty;
    ctx.getLogicalExprInfo().empty = true;
    visit(*node.lhs);
    visit(*node.rhs);
    ctx.getLogicalExprInfo().empty = bak;
    auto res = ctx.makeTempLocalReg("newStr");
    ctx.emplaceInst<Call>(res, "#string#add",
                          ctx.getExprAddr(node.lhs->getID()),
                          ctx.getExprAddr(node.rhs->getID()));
    ctx.setExprAddr(node.getID(), res);
    return;
  }

  static SmallMap<ast::BinaryExpr::OpType, ArithBinaryInst::OpType> opMap{
      {ast::BinaryExpr::BitOr, ArithBinaryInst::BitOr},
      {ast::BinaryExpr::BitAnd, ArithBinaryInst::BitAnd},
      {ast::BinaryExpr::Xor, ArithBinaryInst::Xor},
      {ast::BinaryExpr::Shl, ArithBinaryInst::Shl},
      {ast::BinaryExpr::Shr, ArithBinaryInst::Shr},
      {ast::BinaryExpr::Add, ArithBinaryInst::Add},
      {ast::BinaryExpr::Sub, ArithBinaryInst::Sub},
      {ast::BinaryExpr::Mul, ArithBinaryInst::Mul},
      {ast::BinaryExpr::Div, ArithBinaryInst::Div},
      {ast::BinaryExpr::Mod, ArithBinaryInst::Mod},
  };
  auto bak = ctx.getLogicalExprInfo().empty;
  ctx.getLogicalExprInfo().empty = true;
  visit(*node.lhs);
  visit(*node.rhs);
  ctx.getLogicalExprInfo().empty = bak;
  auto res = ctx.makeTempLocalReg();
  ctx.emplaceInst<ArithBinaryInst>(res, opMap.at(node.op),
                                   ctx.getExprAddr(node.lhs->getID()),
                                   ctx.getExprAddr(node.rhs->getID()));
  ctx.setExprAddr(node.getID(), res);
}